

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lvm.c
# Opt level: O0

lua_Integer luaV_shiftl(lua_Integer x,lua_Integer y)

{
  lua_Integer y_local;
  lua_Integer x_local;
  
  if (y < 0) {
    if (y < -0x3f) {
      x_local = 0;
    }
    else {
      x_local = (ulong)x >> (-(byte)y & 0x3f);
    }
  }
  else if (y < 0x40) {
    x_local = x << ((byte)y & 0x3f);
  }
  else {
    x_local = 0;
  }
  return x_local;
}

Assistant:

lua_Integer luaV_shiftl(lua_Integer x, lua_Integer y) {
    if (y < 0) {  /* shift right? */
        if (y <= -NBITS) return 0;
        else return intop(>>, x, -y);
    } else {  /* shift left */
        if (y >= NBITS) return 0;
        else return intop(<<, x, y);
    }
}